

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void xatlas::internal::TaskScheduler::workerThread
               (TaskScheduler *scheduler,Worker *worker,uint32_t threadIndex)

{
  __atomic_flag_data_type _Var1;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint8_t *puVar5;
  TaskGroup *pTVar6;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  puVar3 = (uint32_t *)__tls_get_addr(&PTR_00139fc0);
  *puVar3 = threadIndex;
  local_40._M_device = &worker->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  do {
    while (((worker->wakeup)._M_base._M_i & 1U) == 0) {
      std::condition_variable::wait((unique_lock *)&worker->cv);
    }
    LOCK();
    (worker->wakeup)._M_base._M_i = false;
    UNLOCK();
    do {
      if (((scheduler->m_shutdown)._M_base._M_i & 1U) != 0) {
        std::unique_lock<std::mutex>::~unique_lock(&local_40);
        return;
      }
      if (scheduler->m_maxGroups == 0) {
        pTVar6 = (TaskGroup *)0x0;
      }
      else {
        uVar4 = 0;
        do {
          pTVar6 = scheduler->m_groups + uVar4;
          if (((scheduler->m_groups[uVar4].free._M_base._M_i & 1U) == 0) &&
             ((pTVar6->ref).super___atomic_base<unsigned_int>._M_i != 0)) {
            do {
              LOCK();
              _Var1 = (pTVar6->queueLock).m_lock.super___atomic_flag_base._M_i;
              (pTVar6->queueLock).m_lock.super___atomic_flag_base._M_i = true;
              UNLOCK();
            } while (_Var1 != false);
            uVar2 = pTVar6->queueHead;
            if (uVar2 < (pTVar6->queue).m_base.size) {
              pTVar6->queueHead = uVar2 + 1;
              puVar5 = (pTVar6->queue).m_base.buffer;
              if (puVar5 == (uint8_t *)0x0) {
                __assert_fail("m_base.buffer",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                              ,0x480,
                              "T &xatlas::internal::Array<xatlas::internal::Task>::operator[](uint32_t) [T = xatlas::internal::Task]"
                             );
              }
              puVar5 = puVar5 + (ulong)uVar2 * 0x10;
              (pTVar6->queueLock).m_lock.super___atomic_flag_base._M_i = false;
              goto LAB_001172dd;
            }
            (pTVar6->queueLock).m_lock.super___atomic_flag_base._M_i = false;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < scheduler->m_maxGroups);
      }
      puVar5 = (uint8_t *)0x0;
LAB_001172dd:
      if (puVar5 == (uint8_t *)0x0) break;
      (**(code **)puVar5)(pTVar6->userData,*(undefined8 *)(puVar5 + 8));
      LOCK();
      (pTVar6->ref).super___atomic_base<unsigned_int>._M_i =
           (pTVar6->ref).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
    } while (puVar5 != (uint8_t *)0x0);
  } while( true );
}

Assistant:

static void workerThread(TaskScheduler *scheduler, Worker *worker, uint32_t threadIndex)
	{
		m_threadIndex = threadIndex;
		std::unique_lock<std::mutex> lock(worker->mutex);
		for (;;) {
			worker->cv.wait(lock, [=]{ return worker->wakeup.load(); });
			worker->wakeup = false;
			for (;;) {
				if (scheduler->m_shutdown)
					return;
				// Look for a task in any of the groups and run it.
				TaskGroup *group = nullptr;
				Task *task = nullptr;
				for (uint32_t i = 0; i < scheduler->m_maxGroups; i++) {
					group = &scheduler->m_groups[i];
					if (group->free || group->ref == 0)
						continue;
					group->queueLock.lock();
					if (group->queueHead < group->queue.size()) {
						task = &group->queue[group->queueHead++];
						group->queueLock.unlock();
						break;
					}
					group->queueLock.unlock();
				}
				if (!task)
					break;
				task->func(group->userData, task->userData);
				group->ref--;
			}
		}
	}